

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
parseOctalLiteral(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  *this)

{
  bool bVar1;
  UnicodeChar UVar2;
  bool local_31;
  anon_class_8_1_8991fb9c local_30;
  UTF8Reader local_28;
  UTF8Reader local_20;
  UTF8Reader local_18;
  UTF8Reader t;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
  *this_local;
  
  t.data = (char *)this;
  UTF8Reader::UTF8Reader(&local_18,&this->input);
  UVar2 = UTF8Reader::operator*(&local_18);
  local_31 = false;
  if (UVar2 == 0x30) {
    UTF8Reader::operator+(&local_20,(int)&local_18);
    bVar1 = UTF8Reader::isDigit(&local_20);
    local_31 = false;
    if (bVar1) {
      UTF8Reader::UTF8Reader(&local_28,&local_18);
      local_30.this = this;
      local_31 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                 ::
                 parseIntegerWithBase<8,soul::Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::parseOctalLiteral()::_lambda(unsigned_int)_1_>
                           ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                             *)this,&local_28,&local_30);
    }
  }
  return local_31;
}

Assistant:

bool parseOctalLiteral()
    {
        auto t = input;

        return *t == '0' && (t + 1).isDigit()
                && parseIntegerWithBase<8> (t, [this] (UnicodeChar c) -> int
                                               {
                                                    if (c >= '0' && c <= '7')  return ((int) c) - '0';
                                                    if (c == '8' || c == '9')  throwError (Errors::decimalDigitInOctal());
                                                    return -1;
                                               });
    }